

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupOutputGroup(Gia_Man_t *p,int iOutStart,int iOutStop)

{
  int iVar1;
  char *pcVar2;
  Gia_Man_t *pNew;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)iOutStart;
  Gia_ManFillValue(p);
  pNew = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar2);
    pcVar4 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar4,pcVar2);
  }
  pNew->pName = pcVar4;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar2);
    pcVar4 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar4,pcVar2);
  }
  pNew->pSpec = pcVar4;
  p->pObjs->Value = 0;
  if (iOutStart < iOutStop) {
    do {
      if ((iOutStart < 0) || (p->vCos->nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Gia_ManDupOrderDfs_rec(pNew,p,p->pObjs + iVar1);
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < iOutStop);
  }
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManDupOutputGroup( Gia_Man_t * p, int iOutStart, int iOutStop )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    for ( i = iOutStart; i < iOutStop; i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    }
    return pNew;
}